

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermOut.cpp
# Opt level: O2

bool __thiscall
glslang::TOutputTraverser::visitSelection
          (TOutputTraverser *this,TVisit param_1,TIntermSelection *node)

{
  TInfoSinkBase *this_00;
  int *piVar1;
  TInfoSink *infoSink;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int iVar2;
  TString local_50;
  
  infoSink = this->infoSink;
  OutputTreeText(infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  this_00 = &infoSink->debug;
  TInfoSinkBase::append(this_00,"Test condition and select");
  TInfoSinkBase::append(this_00," (");
  TIntermTyped::getCompleteString_abi_cxx11_(&local_50,&node->super_TIntermTyped,false);
  TInfoSinkBase::append(this_00,&local_50);
  TInfoSinkBase::append(this_00,")");
  if (node->shortCircuit == false) {
    TInfoSinkBase::append(this_00,": no shortcircuit");
  }
  if (node->flatten == true) {
    TInfoSinkBase::append(this_00,": Flatten");
  }
  if (node->dontFlatten == true) {
    TInfoSinkBase::append(this_00,": DontFlatten");
  }
  TInfoSinkBase::append(this_00,"\n");
  iVar2 = (this->super_TIntermTraverser).depth + 1;
  (this->super_TIntermTraverser).depth = iVar2;
  OutputTreeText(infoSink,(TIntermNode *)node,iVar2);
  TInfoSinkBase::append(this_00,"Condition\n");
  iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x30])(node);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x10))
            ((long *)CONCAT44(extraout_var,iVar2),this);
  OutputTreeText(infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
  iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
  if (CONCAT44(extraout_var_00,iVar2) == 0) {
    TInfoSinkBase::append(this_00,"true case is null\n");
  }
  else {
    TInfoSinkBase::append(this_00,"true case\n");
    iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])(node);
    (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x10))
              ((long *)CONCAT44(extraout_var_01,iVar2),this);
  }
  iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
  if (CONCAT44(extraout_var_02,iVar2) != 0) {
    OutputTreeText(infoSink,(TIntermNode *)node,(this->super_TIntermTraverser).depth);
    TInfoSinkBase::append(this_00,"false case\n");
    iVar2 = (*(node->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x34])(node);
    (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar2) + 0x10))
              ((long *)CONCAT44(extraout_var_03,iVar2),this);
  }
  piVar1 = &(this->super_TIntermTraverser).depth;
  *piVar1 = *piVar1 + -1;
  return false;
}

Assistant:

bool TOutputTraverser::visitSelection(TVisit /* visit */, TIntermSelection* node)
{
    TInfoSink& out = infoSink;

    OutputTreeText(out, node, depth);

    out.debug << "Test condition and select";
    out.debug << " (" << node->getCompleteString() << ")";

    if (node->getShortCircuit() == false)
        out.debug << ": no shortcircuit";
    if (node->getFlatten())
        out.debug << ": Flatten";
    if (node->getDontFlatten())
        out.debug << ": DontFlatten";
    out.debug << "\n";

    ++depth;

    OutputTreeText(out, node, depth);
    out.debug << "Condition\n";
    node->getCondition()->traverse(this);

    OutputTreeText(out, node, depth);
    if (node->getTrueBlock()) {
        out.debug << "true case\n";
        node->getTrueBlock()->traverse(this);
    } else
        out.debug << "true case is null\n";

    if (node->getFalseBlock()) {
        OutputTreeText(out, node, depth);
        out.debug << "false case\n";
        node->getFalseBlock()->traverse(this);
    }

    --depth;

    return false;
}